

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O2

void __thiscall
powerpc_test_cpu::test_instruction_RRS__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  int iVar1;
  long lVar2;
  uint32_t a2;
  
  if (test_instruction_RRS__(char_const*,unsigned_int)::code == '\0') {
    iVar1 = __cxa_guard_acquire(&test_instruction_RRS__(char_const*,unsigned_int)::code);
    if (iVar1 != 0) {
      test_instruction_RRS__::code[0] = 0;
      test_instruction_RRS__::code[1] = 0x4e800020;
      test_instruction_RRS__::code[2] = 0x7c802378;
      test_instruction_RRS__::code[3] = 0;
      test_instruction_RRS__::code[4] = 0x4e800020;
      __cxa_guard_release(&test_instruction_RRS__(char_const*,unsigned_int)::code);
    }
  }
  for (a2 = 0; a2 != 0x20; a2 = a2 + 1) {
    test_instruction_RRS__::code[0] = a2 << 0xb | opcode & 0xffff07ff;
    test_instruction_RRS__::code[3] = test_instruction_RRS__::code[0] & 0xffe0ffff;
    for (lVar2 = 0; lVar2 != 0x90; lVar2 = lVar2 + 4) {
      test_one(this,test_instruction_RRS__::code,insn,*(uint32_t *)((long)reg_values + lVar2),a2,0,0
              );
    }
  }
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_RRS__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_values = sizeof(reg_values)/sizeof(reg_values[0]);

	for (int j = 0; j < 32; j++) {
		const uint32_t sh = j;
		SH_field::insert(opcode, sh);
		code[0] = code[3] = opcode;
		rA_field::insert(code[3], 0);
		flush_icache_range(code, sizeof(code));
		for (int i = 0; i < n_values; i++) {
			const uint32_t ra = reg_values[i];
			test_one(&code[0], insn, ra, sh, 0);
		}
	}
}